

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram::genFunctionCall_abi_cxx11_
          (string *__return_storage_ptr__,void *this,ShaderSamplingType samplingType,int uniformIdx)

{
  ostream *poVar1;
  undefined1 local_198 [8];
  ostringstream functionCall;
  int uniformIdx_local;
  ShaderSamplingType samplingType_local;
  SRGBTestProgram *this_local;
  
  functionCall._368_4_ = uniformIdx;
  functionCall._372_4_ = samplingType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  poVar1 = std::operator<<((ostream *)local_198,"\tmediump vec4 texelColor");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,functionCall._368_4_);
  std::operator<<(poVar1," = ");
  switch(functionCall._372_4_) {
  case (BADTYPE)0x0:
    poVar1 = std::operator<<((ostream *)local_198,"texture(uTexture");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,functionCall._368_4_);
    std::operator<<(poVar1,", vs_aTexCoord); \n");
    break;
  case (BADTYPE)0x1:
    poVar1 = std::operator<<((ostream *)local_198,"textureLod(uTexture");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,functionCall._368_4_);
    std::operator<<(poVar1,", vs_aTexCoord, 0.0); \n");
    break;
  case (BADTYPE)0x2:
    poVar1 = std::operator<<((ostream *)local_198,"textureGrad(uTexture");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,functionCall._368_4_);
    std::operator<<(poVar1,", vs_aTexCoord, vec2(0.0, 0.0), vec2(0.0, 0.0)); \n");
    break;
  case (BADTYPE)0x3:
    poVar1 = std::operator<<((ostream *)local_198,"textureOffset(uTexture");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,functionCall._368_4_);
    std::operator<<(poVar1,", vs_aTexCoord, ivec2(0.0, 0.0)); \n");
    break;
  case (BADTYPE)0x4:
    poVar1 = std::operator<<((ostream *)local_198,"textureProj(uTexture");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,functionCall._368_4_);
    std::operator<<(poVar1,", vec3(vs_aTexCoord, 1.0)); \n");
    break;
  case (BADTYPE)0x5:
    poVar1 = std::operator<<((ostream *)local_198,"texelFetch(uTexture");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,functionCall._368_4_);
    std::operator<<(poVar1,", ivec2(vs_aTexCoord), 0); \n");
    break;
  case (BADTYPE)0x6:
    poVar1 = std::operator<<((ostream *)local_198,"texelFetchOffset(uTexture");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,functionCall._368_4_);
    std::operator<<(poVar1,", ivec2(vs_aTexCoord), 0, ivec2(0.0, 0.0)); \n");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string SRGBTestProgram::genFunctionCall (ShaderSamplingType samplingType, const int uniformIdx)
{
	std::ostringstream functionCall;

	functionCall << "	mediump vec4 texelColor" << uniformIdx << " = ";

	switch (samplingType)
		{
			case TEXTURESAMPLING_TEXTURE:
			{
				functionCall << "texture(uTexture" << uniformIdx << ", vs_aTexCoord); \n";
				break;
			}
			case TEXTURESAMPLING_TEXTURE_LOD:
			{
				functionCall << "textureLod(uTexture" << uniformIdx << ", vs_aTexCoord, 0.0); \n";
				break;
			}
			case TEXTURESAMPLING_TEXTURE_GRAD:
			{
				functionCall << "textureGrad(uTexture" << uniformIdx << ", vs_aTexCoord, vec2(0.0, 0.0), vec2(0.0, 0.0)); \n";
				break;
			}
			case TEXTURESAMPLING_TEXTURE_OFFSET:
			{
				functionCall << "textureOffset(uTexture" << uniformIdx << ", vs_aTexCoord, ivec2(0.0, 0.0)); \n";
				break;
			}
			case TEXTURESAMPLING_TEXTURE_PROJ:
			{
				functionCall << "textureProj(uTexture" << uniformIdx << ", vec3(vs_aTexCoord, 1.0)); \n";
				break;
			}
			case TEXTURESAMPLING_TEXELFETCH:
			{
				functionCall << "texelFetch(uTexture" << uniformIdx << ", ivec2(vs_aTexCoord), 0); \n";
				break;
			}
			case TEXTURESAMPLING_TEXELFETCH_OFFSET:
			{
				functionCall << "texelFetchOffset(uTexture" << uniformIdx << ", ivec2(vs_aTexCoord), 0, ivec2(0.0, 0.0)); \n";
				break;
			}
			default:
			{
				DE_FATAL("Error: Sampling type not recognised");
			}
		}

	return functionCall.str();
}